

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subdivision.cpp
# Opt level: O2

void __thiscall
CatmullClarkSubdivider::Subdivide
          (CatmullClarkSubdivider *this,aiMesh **smesh,size_t nmesh,aiMesh **out,uint num,
          bool discard_input)

{
  aiMesh *this_00;
  size_t s;
  Logger *pLVar1;
  size_t s_2;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  size_t s_1;
  long lVar5;
  aiMesh *i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> maptbl;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> outmeshes;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> inmeshes;
  aiMesh *local_a8;
  uint local_9c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  _Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_> local_78;
  aiMesh *local_60;
  _Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_> local_58;
  CatmullClarkSubdivider *local_38;
  
  if (smesh == (aiMesh **)0x0) {
    __assert_fail("__null != smesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                  ,0x91,
                  "virtual void CatmullClarkSubdivider::Subdivide(aiMesh **, size_t, aiMesh **, unsigned int, bool)"
                 );
  }
  if (out != (aiMesh **)0x0) {
    if (smesh == out) {
      __assert_fail("smesh<out || smesh+nmesh>out+nmesh",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                    ,0x95,
                    "virtual void CatmullClarkSubdivider::Subdivide(aiMesh **, size_t, aiMesh **, unsigned int, bool)"
                   );
    }
    if (num == 0) {
      if (discard_input) {
        for (sVar2 = 0; nmesh != sVar2; sVar2 = sVar2 + 1) {
          out[sVar2] = smesh[sVar2];
          smesh[sVar2] = (aiMesh *)0x0;
        }
      }
      else {
        for (sVar2 = 0; nmesh != sVar2; sVar2 = sVar2 + 1) {
          Assimp::SceneCombiner::Copy(out,smesh[sVar2]);
          out = out + 1;
        }
      }
    }
    else {
      local_58._M_impl.super__Vector_impl_data._M_start = (aiMesh **)0x0;
      local_58._M_impl.super__Vector_impl_data._M_finish = (aiMesh **)0x0;
      local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_start = (aiMesh **)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_9c = num;
      local_38 = this;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&local_58,nmesh);
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&local_78,nmesh);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98,nmesh);
      lVar5 = 0;
      for (sVar2 = 0; nmesh != sVar2; sVar2 = sVar2 + 1) {
        local_a8 = smesh[sVar2];
        if (local_a8->mPrimitiveTypes - 1 < 3) {
          pLVar1 = Assimp::DefaultLogger::get();
          Assimp::Logger::debug(pLVar1,"Catmull-Clark Subdivider: Skipping pure line/point mesh");
          if (discard_input) {
            out[sVar2] = local_a8;
            smesh[sVar2] = (aiMesh *)0x0;
          }
          else {
            Assimp::SceneCombiner::Copy((aiMesh **)((long)out + lVar5),local_a8);
          }
        }
        else {
          local_60 = (aiMesh *)0x0;
          std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
                    ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_78,&local_60);
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                    ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&local_58,&local_a8);
          local_60 = (aiMesh *)CONCAT44(local_60._4_4_,(int)sVar2);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98,
                     (uint *)&local_60);
        }
        lVar5 = lVar5 + 8;
      }
      if (((long)local_58._M_impl.super__Vector_impl_data._M_finish -
           (long)local_58._M_impl.super__Vector_impl_data._M_start !=
           (long)local_78._M_impl.super__Vector_impl_data._M_finish -
           (long)local_78._M_impl.super__Vector_impl_data._M_start) ||
         (sVar2 = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_58._M_impl.super__Vector_impl_data._M_start >> 3,
         sVar2 != (long)local_98._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_98._M_impl.super__Vector_impl_data._M_start >> 2)) {
        __assert_fail("inmeshes.size()==outmeshes.size()&&inmeshes.size()==maptbl.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                      ,200,
                      "virtual void CatmullClarkSubdivider::Subdivide(aiMesh **, size_t, aiMesh **, unsigned int, bool)"
                     );
      }
      if (local_58._M_impl.super__Vector_impl_data._M_start ==
          local_58._M_impl.super__Vector_impl_data._M_finish) {
        pLVar1 = Assimp::DefaultLogger::get();
        Assimp::Logger::warn
                  (pLVar1,"Catmull-Clark Subdivider: Pure point/line scene, I can\'t do anything");
      }
      else {
        InternSubdivide(local_38,local_58._M_impl.super__Vector_impl_data._M_start,sVar2,
                        local_78._M_impl.super__Vector_impl_data._M_start,local_9c);
        for (uVar3 = 0; uVar4 = (ulong)uVar3,
            uVar4 < (ulong)((long)local_98._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_98._M_impl.super__Vector_impl_data._M_start >> 2);
            uVar3 = uVar3 + 1) {
          if (local_78._M_impl.super__Vector_impl_data._M_start[uVar4] == (aiMesh *)0x0) {
            __assert_fail("nullptr != outmeshes[i]",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                          ,0xcf,
                          "virtual void CatmullClarkSubdivider::Subdivide(aiMesh **, size_t, aiMesh **, unsigned int, bool)"
                         );
          }
          out[local_98._M_impl.super__Vector_impl_data._M_start[uVar4]] =
               local_78._M_impl.super__Vector_impl_data._M_start[uVar4];
        }
        if (discard_input) {
          for (sVar2 = 0; nmesh != sVar2; sVar2 = sVar2 + 1) {
            this_00 = smesh[sVar2];
            if (this_00 != (aiMesh *)0x0) {
              aiMesh::~aiMesh(this_00);
            }
            operator_delete(this_00,0x520);
          }
        }
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_98);
      std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base(&local_78);
      std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base(&local_58);
    }
    return;
  }
  __assert_fail("__null != out",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Subdivision.cpp"
                ,0x92,
                "virtual void CatmullClarkSubdivider::Subdivide(aiMesh **, size_t, aiMesh **, unsigned int, bool)"
               );
}

Assistant:

void CatmullClarkSubdivider::Subdivide (
    aiMesh** smesh,
    size_t nmesh,
    aiMesh** out,
    unsigned int num,
    bool discard_input
    )
{
    ai_assert( NULL != smesh );
    ai_assert( NULL != out );

    // course, both regions may not overlap
    ai_assert(smesh<out || smesh+nmesh>out+nmesh);
    if (!num) {
        // No subdivision at all. Need to copy all the meshes .. argh.
        if (discard_input) {
            for (size_t s = 0; s < nmesh; ++s) {
                out[s] = smesh[s];
                smesh[s] = NULL;
            }
        }
        else {
            for (size_t s = 0; s < nmesh; ++s) {
                SceneCombiner::Copy(out+s,smesh[s]);
            }
        }
        return;
    }

    std::vector<aiMesh*> inmeshes;
    std::vector<aiMesh*> outmeshes;
    std::vector<unsigned int> maptbl;

    inmeshes.reserve(nmesh);
    outmeshes.reserve(nmesh);
    maptbl.reserve(nmesh);

    // Remove pure line and point meshes from the working set to reduce the
    // number of edge cases the subdivider is forced to deal with. Line and
    // point meshes are simply passed through.
    for (size_t s = 0; s < nmesh; ++s) {
        aiMesh* i = smesh[s];
        // FIX - mPrimitiveTypes might not yet be initialized
        if (i->mPrimitiveTypes && (i->mPrimitiveTypes & (aiPrimitiveType_LINE|aiPrimitiveType_POINT))==i->mPrimitiveTypes) {
            ASSIMP_LOG_DEBUG("Catmull-Clark Subdivider: Skipping pure line/point mesh");

            if (discard_input) {
                out[s] = i;
                smesh[s] = NULL;
            }
            else {
                SceneCombiner::Copy(out+s,i);
            }
            continue;
        }

        outmeshes.push_back(NULL);inmeshes.push_back(i);
        maptbl.push_back(static_cast<unsigned int>(s));
    }

    // Do the actual subdivision on the preallocated storage. InternSubdivide
    // *always* assumes that enough storage is available, it does not bother
    // checking any ranges.
    ai_assert(inmeshes.size()==outmeshes.size()&&inmeshes.size()==maptbl.size());
    if (inmeshes.empty()) {
        ASSIMP_LOG_WARN("Catmull-Clark Subdivider: Pure point/line scene, I can't do anything");
        return;
    }
    InternSubdivide(&inmeshes.front(),inmeshes.size(),&outmeshes.front(),num);
    for (unsigned int i = 0; i < maptbl.size(); ++i) {
        ai_assert(nullptr != outmeshes[i]);
        out[maptbl[i]] = outmeshes[i];
    }

    if (discard_input) {
        for (size_t s = 0; s < nmesh; ++s) {
            delete smesh[s];
        }
    }
}